

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O1

void celero::executor::Run(string *benchmarkName,string *experimentName)

{
  string *x;
  shared_ptr<celero::Experiment> e;
  shared_ptr<celero::Benchmark> bmark;
  shared_ptr<celero::Experiment> local_48;
  _Head_base<0UL,_celero::Benchmark::Impl_*,_false> local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  __uniq_ptr_impl<celero::TestVector::Impl,_std::default_delete<celero::TestVector::Impl>_> local_28
  ;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  x = (string *)TestVector::Instance();
  TestVector::operator[]((TestVector *)&local_28,x);
  if (local_28._M_t.
      super__Tuple_impl<0UL,_celero::TestVector::Impl_*,_std::default_delete<celero::TestVector::Impl>_>
      .super__Head_base<0UL,_celero::TestVector::Impl_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_celero::TestVector::Impl_*,_std::default_delete<celero::TestVector::Impl>_>)
      0x0) {
    Benchmark::getExperiment
              ((Benchmark *)&local_38,
               (string *)
               local_28._M_t.
               super__Tuple_impl<0UL,_celero::TestVector::Impl_*,_std::default_delete<celero::TestVector::Impl>_>
               .super__Head_base<0UL,_celero::TestVector::Impl_*,_false>._M_head_impl);
    if (local_38._M_head_impl == (Impl *)0x0) {
      __assert_fail("e != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/DigitalInBlue[P]Celero/src/Executor.cpp"
                    ,0x1a0,"void celero::executor::Run(const std::string &, const std::string &)");
    }
    local_48.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_38._M_head_impl;
    local_48.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_30;
    if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_30->_M_use_count = local_30->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_30->_M_use_count = local_30->_M_use_count + 1;
      }
    }
    Run(&local_48);
    if (local_48.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
    }
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

void executor::Run(const std::string& benchmarkName, const std::string& experimentName)
{
	auto bmark = celero::TestVector::Instance()[benchmarkName];

	if(bmark != nullptr)
	{
		auto e = bmark->getExperiment(experimentName);
		assert(e != nullptr);
		executor::Run(e);
	}
}